

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O3

void __thiscall DIS::LinearObjectStatePdu::LinearObjectStatePdu(LinearObjectStatePdu *this)

{
  SyntheticEnvironmentFamilyPdu::SyntheticEnvironmentFamilyPdu
            (&this->super_SyntheticEnvironmentFamilyPdu);
  (this->super_SyntheticEnvironmentFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__LinearObjectStatePdu_001b5148;
  EntityID::EntityID(&this->_objectID);
  EntityID::EntityID(&this->_referencedObjectID);
  this->_updateNumber = 0;
  this->_forceID = '\0';
  this->_numberOfSegments = '\0';
  SimulationAddress::SimulationAddress(&this->_requesterID);
  SimulationAddress::SimulationAddress(&this->_receivingID);
  ObjectType::ObjectType(&this->_objectType);
  (this->_linearSegmentParameters).
  super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_linearSegmentParameters).
  super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_linearSegmentParameters).
  super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PduSuperclass::setPduType((PduSuperclass *)this,',');
  return;
}

Assistant:

LinearObjectStatePdu::LinearObjectStatePdu() : SyntheticEnvironmentFamilyPdu(),
   _objectID(), 
   _referencedObjectID(), 
   _updateNumber(0), 
   _forceID(0), 
   _numberOfSegments(0), 
   _requesterID(), 
   _receivingID(), 
   _objectType()
{
    setPduType( 44 );
}